

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

LY_ERR moveto_union(lyxp_set *set1,lyxp_set *set2)

{
  lyd_node_inner *plVar1;
  lyd_node_inner *plVar2;
  lyxp_set_type lVar3;
  int iVar4;
  LY_ERR LVar5;
  undefined8 uVar6;
  lyxp_set_node *plVar7;
  lyd_node_inner *plVar8;
  uint uVar9;
  uint uVar10;
  ly_ctx *ctx;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint local_40;
  int local_3c;
  
  lVar3 = set1->type;
  if ((long)(int)lVar3 == 0) {
    lVar3 = set2->type;
    if (lVar3 == LYXP_SET_NODE_SET) {
      if (set2->used == 0) {
        return LY_SUCCESS;
      }
      if (set1->used == 0) {
        lyxp_set_free_content(set1);
        memcpy(set1,set2,0x90);
        memset(set2,0,0x90);
        return LY_SUCCESS;
      }
      iVar4 = set_sort(set1);
      if ((iVar4 != 0) || (iVar4 = set_sort(set2), iVar4 != 0)) {
        __assert_fail("!set_sort(set1) && !set_sort(set2)",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                      ,0x1bee,"LY_ERR moveto_union(struct lyxp_set *, struct lyxp_set *)");
      }
      if (set1->type != LYXP_SET_NODE_SET) {
        return LY_EINVAL;
      }
      if (set2->type != LYXP_SET_NODE_SET) {
        return LY_EINVAL;
      }
      if (set2->used != 0) {
        if (set1->used != 0) {
          plVar8 = (lyd_node_inner *)set1->tree;
          do {
            plVar1 = (plVar8->field_0).node.parent;
            plVar2 = plVar8;
            plVar8 = plVar1;
          } while (plVar1 != (lyd_node_inner *)0x0);
          do {
            plVar8 = plVar2;
            plVar2 = (lyd_node_inner *)(plVar8->field_0).node.prev;
          } while ((plVar2->field_0).node.next != (lyd_node *)0x0);
          LVar5 = set_assign_pos(set1,(lyd_node *)plVar8,set1->root_type);
          if (LVar5 != LY_SUCCESS) {
            return LY_EINT;
          }
          LVar5 = set_assign_pos(set2,(lyd_node *)plVar8,set2->root_type);
          if (LVar5 != LY_SUCCESS) {
            return LY_EINT;
          }
          uVar9 = 0;
          ly_log_dbg(2,"MERGE target");
          print_set_debug(set1);
          ly_log_dbg(2,"MERGE source");
          print_set_debug(set2);
          if (set1->size - set1->used < set2->used) {
            uVar10 = set2->used + set1->used;
            set1->size = uVar10;
            plVar7 = (lyxp_set_node *)ly_realloc((set1->val).nodes,(ulong)uVar10 << 4);
            (set1->val).nodes = plVar7;
            if (plVar7 == (lyxp_set_node *)0x0) {
              ly_log(set2->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "set_sorted_merge");
              return LY_EMEM;
            }
          }
          uVar13 = 0;
          uVar10 = 0;
          local_3c = 0;
LAB_001aa384:
          uVar15 = (uint)uVar13;
          iVar4 = set_sort_compare((set2->val).nodes + uVar9,(set1->val).nodes + uVar13);
          if (iVar4 == 0) {
            if (uVar10 == 0) {
              uVar9 = uVar9 + 1;
              uVar13 = (ulong)(uVar15 + 1);
              uVar10 = 0;
            }
            else {
              uVar10 = uVar10 + 1;
              local_3c = local_3c + 1;
              uVar9 = uVar9 + 1;
              uVar13 = (ulong)(uVar15 + 1);
            }
          }
          else if (iVar4 < 0) {
            uVar10 = uVar10 + 1;
            set_insert_node_hash(set1,(set2->val).nodes[uVar9].node,(set2->val).nodes[uVar9].type);
            uVar9 = uVar9 + 1;
          }
          else {
            local_40 = uVar9;
            if (uVar10 != 0) goto LAB_001aa477;
            uVar10 = 0;
            uVar13 = (ulong)(uVar15 + 1);
          }
          do {
            local_40 = set2->used;
            uVar15 = (uint)uVar13;
            if (uVar9 < local_40) {
              if (uVar15 < set1->used) goto LAB_001aa384;
              uVar12 = (ulong)uVar9;
              uVar14 = uVar12 << 4 | 8;
              do {
                set_insert_node_hash
                          (set1,*(lyd_node **)((long)(set2->val).nodes + (uVar14 - 8)),
                           *(lyxp_node_type *)((long)&((set2->val).nodes)->node + uVar14));
                uVar12 = uVar12 + 1;
                local_40 = set2->used;
                uVar14 = uVar14 + 0x10;
              } while (uVar12 < local_40);
            }
            else if (uVar10 == 0) {
              if ((set1->ht == (ly_ht *)0x0) && (3 < set1->used)) {
                set_insert_node_hash(set1,(lyd_node *)0x0,LYXP_NODE_NONE);
              }
              ly_log_dbg(2,"MERGE result");
              print_set_debug(set1);
              goto LAB_001aa533;
            }
            uVar10 = (uVar10 - uVar9) + local_40;
LAB_001aa477:
            uVar12 = (ulong)(uVar15 + (uVar10 - local_3c));
            memmove((set1->val).nodes + uVar12,(set1->val).nodes + uVar13,
                    (ulong)(set1->used - uVar15) << 4);
            memcpy((set1->val).nodes + (uVar15 - local_3c),(set2->val).nodes + (local_40 - uVar10),
                   (ulong)uVar10 << 4);
            set1->used = set1->used + (uVar10 - local_3c);
            uVar10 = 0;
            local_3c = 0;
            uVar13 = uVar12;
            uVar9 = local_40;
          } while( true );
        }
        set_fill_set(set1,set2);
LAB_001aa533:
        lyxp_set_free_content(set2);
      }
      iVar4 = set_sort(set1);
      if (iVar4 == 0) {
        return LY_SUCCESS;
      }
      __assert_fail("!set_sort(set1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                    ,0x1bf5,"LY_ERR moveto_union(struct lyxp_set *, struct lyxp_set *)");
    }
    ctx = set1->ctx;
    pcVar11 = "node set";
  }
  else {
    if (lVar3 < (LYXP_SET_STRING|LYXP_SET_SCNODE_SET)) {
      pcVar11 = *(char **)(&DAT_001fe698 + (long)(int)lVar3 * 8);
    }
    else {
      pcVar11 = (char *)0x0;
    }
    ctx = set1->ctx;
    lVar3 = set2->type;
  }
  if (lVar3 < (LYXP_SET_STRING|LYXP_SET_SCNODE_SET)) {
    uVar6 = *(undefined8 *)(&DAT_001fe650 + (ulong)lVar3 * 8);
  }
  else {
    uVar6 = 0;
  }
  ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Cannot apply XPath operation %s on %s and %s.","union",pcVar11
          ,uVar6);
  return LY_EVALID;
}

Assistant:

static LY_ERR
moveto_union(struct lyxp_set *set1, struct lyxp_set *set2)
{
    LY_ERR rc;

    if ((set1->type != LYXP_SET_NODE_SET) || (set2->type != LYXP_SET_NODE_SET)) {
        LOGVAL(set1->ctx, LY_VCODE_XP_INOP_2, "union", print_set_type(set1), print_set_type(set2));
        return LY_EVALID;
    }

    /* set2 is empty or both set1 and set2 */
    if (!set2->used) {
        return LY_SUCCESS;
    }

    if (!set1->used) {
        /* release hidden allocated data (lyxp_set.size) */
        lyxp_set_free_content(set1);
        /* direct copying of the entire structure */
        memcpy(set1, set2, sizeof *set1);
        /* dynamic memory belongs to set1 now, do not free */
        memset(set2, 0, sizeof *set2);
        return LY_SUCCESS;
    }

    /* we assume sets are sorted */
    assert(!set_sort(set1) && !set_sort(set2));

    /* sort, remove duplicates */
    rc = set_sorted_merge(set1, set2);
    LY_CHECK_RET(rc);

    /* final set must be sorted */
    assert(!set_sort(set1));

    return LY_SUCCESS;
}